

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

bool Cmd::isUnsupportedTerm(void)

{
  char *__s;
  bool bVar1;
  char *__s_00;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  string_view a;
  string_view b;
  
  __s_00 = getenv("TERM");
  if (__s_00 == (char *)0x0) {
    bVar1 = false;
  }
  else {
    lVar4 = 0;
    do {
      __s = *(char **)((long)isUnsupportedTerm::unsupported_terms + lVar4);
      sVar2 = strlen(__s_00);
      sVar3 = strlen(__s);
      a._M_str = __s_00;
      a._M_len = sVar2;
      b._M_str = __s;
      b._M_len = sVar3;
      bVar1 = iequals(a,b);
      if (bVar1) {
        return bVar1;
      }
      bVar5 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar5);
  }
  return bVar1;
}

Assistant:

static bool isUnsupportedTerm() {

		const char *term = getenv("TERM");
		if (!term) {
			return false;
		}

		static const char *unsupported_terms[] = {"dumb", "cons25", "emacs"};
		for (const char *t : unsupported_terms) {
			if (iequals(term, t)) {
				return true;
			}
		}

		return false;
	}